

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::Utils::Buffer::BindRange
          (Buffer *this,GLuint index,GLintptr offset,GLsizeiptr size)

{
  GLuint GVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  GVar1 = this->m_id;
  GVar3 = GetBufferGLenum(this->m_buffer);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x50))(GVar3,index,GVar1,offset,size);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x717);
  return;
}

Assistant:

void Buffer::BindRange(GLuint index, GLintptr offset, GLsizeiptr size) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	BindRange(gl, m_id, m_buffer, index, offset, size);
}